

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

isoent * isoent_new(isofile *file)

{
  mode_t mVar1;
  isoent *isoent;
  isofile *file_local;
  
  file_local = (isofile *)calloc(1,0xf0);
  if (file_local == (isofile *)0x0) {
    file_local = (isofile *)0x0;
  }
  else {
    file_local->hardlink_target = file;
    (file_local->parentdir).s = (char *)0x0;
    (file_local->parentdir).length = (size_t)&file_local->parentdir;
    __archive_rb_tree_init((archive_rb_tree *)&file_local->basename,&isoent_new::rb_ops);
    (file_local->basename).buffer_length = 0;
    (file_local->basename_utf16).s = (char *)&(file_local->basename).buffer_length;
    file_local[1].datanext = (isofile *)0x0;
    file_local[1].hlnext = (isofile *)&file_local[1].datanext;
    file_local[1].hardlink_target = (isofile *)0x0;
    mVar1 = archive_entry_filetype(file->entry);
    if (mVar1 == 0x4000) {
      *(byte *)&file_local[1].entry = *(byte *)&file_local[1].entry & 0xfd | 2;
    }
  }
  return (isoent *)file_local;
}

Assistant:

static struct isoent *
isoent_new(struct isofile *file)
{
	struct isoent *isoent;
	static const struct archive_rb_tree_ops rb_ops = {
		isoent_cmp_node, isoent_cmp_key,
	};

	isoent = calloc(1, sizeof(*isoent));
	if (isoent == NULL)
		return (NULL);
	isoent->file = file;
	isoent->children.first = NULL;
	isoent->children.last = &(isoent->children.first);
	__archive_rb_tree_init(&(isoent->rbtree), &rb_ops);
	isoent->subdirs.first = NULL;
	isoent->subdirs.last = &(isoent->subdirs.first);
	isoent->extr_rec_list.first = NULL;
	isoent->extr_rec_list.last = &(isoent->extr_rec_list.first);
	isoent->extr_rec_list.current = NULL;
	if (archive_entry_filetype(file->entry) == AE_IFDIR)
		isoent->dir = 1;

	return (isoent);
}